

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * columnTypeImpl(NameContext *pNC,Expr *pExpr,char **pzOrigDb,char **pzOrigTab,char **pzOrigCol
                     ,u8 *pEstWidth)

{
  u8 uVar1;
  long lVar2;
  int iVar3;
  bool bVar4;
  Expr *p_1;
  Select *pS_1;
  NameContext sNC_1;
  int iDb;
  Expr *p;
  NameContext sNC;
  SrcList *pTabList;
  long *plStack_70;
  int iCol;
  Select *pS;
  Table *pTab;
  char *zOrigCol;
  char *zOrigTab;
  char *zOrigDb;
  u8 estWidth;
  char *pcStack_40;
  int j;
  char *zType;
  u8 *pEstWidth_local;
  char **pzOrigCol_local;
  char **pzOrigTab_local;
  char **pzOrigDb_local;
  Expr *pExpr_local;
  NameContext *pNC_local;
  
  pcStack_40 = (char *)0x0;
  zOrigDb._3_1_ = '\x01';
  zOrigTab = (char *)0x0;
  zOrigCol = (char *)0x0;
  pTab = (Table *)0x0;
  uVar1 = pExpr->op;
  zType = (char *)pEstWidth;
  pEstWidth_local = (u8 *)pzOrigCol;
  pzOrigCol_local = pzOrigTab;
  pzOrigTab_local = pzOrigDb;
  pzOrigDb_local = (char **)pExpr;
  pExpr_local = (Expr *)pNC;
  if (uVar1 == 'w') {
    sNC_1.pParse = (Parse *)((pExpr->x).pSelect)->pSrc;
    pS_1 = (Select *)pNC->pParse;
    sNC_1.pAggInfo = (AggInfo *)pNC;
    pcStack_40 = columnTypeImpl((NameContext *)&pS_1,((pExpr->x).pSelect)->pEList->a[0].pExpr,
                                &zOrigTab,&zOrigCol,(char **)&pTab,(u8 *)((long)&zOrigDb + 3));
  }
  else if ((uVar1 == 0x98) || (uVar1 == 0x9a)) {
    pS = (Select *)0x0;
    plStack_70 = (long *)0x0;
    pTabList._4_4_ = (int)pExpr->iColumn;
    while (pExpr_local != (Expr *)0x0 && pS == (Select *)0x0) {
      sNC._48_8_ = (pExpr_local->u).zToken;
      zOrigDb._4_4_ = 0;
      while( true ) {
        bVar4 = false;
        if (zOrigDb._4_4_ < *(int *)sNC._48_8_) {
          bVar4 = *(int *)(sNC._48_8_ + ((long)zOrigDb._4_4_ * 0x1c + 0x13) * 4) != pExpr->iTable;
        }
        if (!bVar4) break;
        zOrigDb._4_4_ = zOrigDb._4_4_ + 1;
      }
      if (zOrigDb._4_4_ < *(int *)sNC._48_8_) {
        pS = *(Select **)(sNC._48_8_ + ((long)zOrigDb._4_4_ * 0x1c + 10) * 4);
        plStack_70 = *(long **)(sNC._48_8_ + ((long)zOrigDb._4_4_ * 0x1c + 0xc) * 4);
      }
      else {
        pExpr_local = (Expr *)(pExpr_local->x).pList;
      }
    }
    if (pS != (Select *)0x0) {
      if (plStack_70 == (long *)0x0) {
        if (pS[1].pEList != (ExprList *)0x0) {
          if (pTabList._4_4_ < 0) {
            pTabList._4_4_ = (int)*(short *)((long)&pS->pOrderBy + 4);
          }
          if (pTabList._4_4_ < 0) {
            pcStack_40 = "INTEGER";
            pTab = (Table *)0x47f5fa;
          }
          else {
            pTab = *(Table **)(*(long *)&pS->op + (long)pTabList._4_4_ * 0x20);
            pcStack_40 = sqlite3ColumnType((Column *)
                                           (*(long *)&pS->op + (long)pTabList._4_4_ * 0x20),
                                           (char *)0x0);
            zOrigDb._3_1_ = *(char *)(*(long *)&pS->op + (long)pTabList._4_4_ * 0x20 + 0x1a);
          }
          zOrigCol = (char *)pS->pEList;
          lVar2._0_1_ = pExpr_local->op;
          lVar2._1_1_ = pExpr_local->affinity;
          lVar2._2_2_ = *(undefined2 *)&pExpr_local->field_0x2;
          lVar2._4_4_ = pExpr_local->flags;
          if (lVar2 != 0) {
            iVar3 = sqlite3SchemaToIndex
                              ((sqlite3 *)**(undefined8 **)pExpr_local,(Schema *)pS[1].pEList);
            zOrigTab = *(char **)(*(long *)(**(long **)pExpr_local + 0x20) + (long)iVar3 * 0x20);
          }
        }
      }
      else if ((-1 < pTabList._4_4_) && (pTabList._4_4_ < *(int *)*plStack_70)) {
        sNC.pParse = (Parse *)plStack_70[4];
        sNC.pAggInfo = (AggInfo *)pExpr_local;
        p = *(Expr **)pExpr_local;
        pcStack_40 = columnTypeImpl((NameContext *)&p,
                                    *(Expr **)(*plStack_70 + 8 + (long)pTabList._4_4_ * 0x20),
                                    &zOrigTab,&zOrigCol,(char **)&pTab,(u8 *)((long)&zOrigDb + 3));
      }
    }
  }
  if (pzOrigTab_local != (char **)0x0) {
    *pzOrigTab_local = zOrigTab;
    *pzOrigCol_local = zOrigCol;
    *(Table **)pEstWidth_local = pTab;
  }
  if (zType != (char *)0x0) {
    *zType = zOrigDb._3_1_;
  }
  return pcStack_40;
}

Assistant:

static const char *columnTypeImpl(
  NameContext *pNC, 
  Expr *pExpr,
#ifdef SQLITE_ENABLE_COLUMN_METADATA
  const char **pzOrigDb,
  const char **pzOrigTab,
  const char **pzOrigCol,
#endif
  u8 *pEstWidth
){
  char const *zType = 0;
  int j;
  u8 estWidth = 1;
#ifdef SQLITE_ENABLE_COLUMN_METADATA
  char const *zOrigDb = 0;
  char const *zOrigTab = 0;
  char const *zOrigCol = 0;
#endif

  assert( pExpr!=0 );
  assert( pNC->pSrcList!=0 );
  switch( pExpr->op ){
    case TK_AGG_COLUMN:
    case TK_COLUMN: {
      /* The expression is a column. Locate the table the column is being
      ** extracted from in NameContext.pSrcList. This table may be real
      ** database table or a subquery.
      */
      Table *pTab = 0;            /* Table structure column is extracted from */
      Select *pS = 0;             /* Select the column is extracted from */
      int iCol = pExpr->iColumn;  /* Index of column in pTab */
      testcase( pExpr->op==TK_AGG_COLUMN );
      testcase( pExpr->op==TK_COLUMN );
      while( pNC && !pTab ){
        SrcList *pTabList = pNC->pSrcList;
        for(j=0;j<pTabList->nSrc && pTabList->a[j].iCursor!=pExpr->iTable;j++);
        if( j<pTabList->nSrc ){
          pTab = pTabList->a[j].pTab;
          pS = pTabList->a[j].pSelect;
        }else{
          pNC = pNC->pNext;
        }
      }

      if( pTab==0 ){
        /* At one time, code such as "SELECT new.x" within a trigger would
        ** cause this condition to run.  Since then, we have restructured how
        ** trigger code is generated and so this condition is no longer 
        ** possible. However, it can still be true for statements like
        ** the following:
        **
        **   CREATE TABLE t1(col INTEGER);
        **   SELECT (SELECT t1.col) FROM FROM t1;
        **
        ** when columnType() is called on the expression "t1.col" in the 
        ** sub-select. In this case, set the column type to NULL, even
        ** though it should really be "INTEGER".
        **
        ** This is not a problem, as the column type of "t1.col" is never
        ** used. When columnType() is called on the expression 
        ** "(SELECT t1.col)", the correct type is returned (see the TK_SELECT
        ** branch below.  */
        break;
      }

      assert( pTab && pExpr->pTab==pTab );
      if( pS ){
        /* The "table" is actually a sub-select or a view in the FROM clause
        ** of the SELECT statement. Return the declaration type and origin
        ** data for the result-set column of the sub-select.
        */
        if( iCol>=0 && iCol<pS->pEList->nExpr ){
          /* If iCol is less than zero, then the expression requests the
          ** rowid of the sub-select or view. This expression is legal (see 
          ** test case misc2.2.2) - it always evaluates to NULL.
          */
          NameContext sNC;
          Expr *p = pS->pEList->a[iCol].pExpr;
          sNC.pSrcList = pS->pSrc;
          sNC.pNext = pNC;
          sNC.pParse = pNC->pParse;
          zType = columnType(&sNC, p,&zOrigDb,&zOrigTab,&zOrigCol, &estWidth); 
        }
      }else if( pTab->pSchema ){
        /* A real table */
        assert( !pS );
        if( iCol<0 ) iCol = pTab->iPKey;
        assert( iCol==-1 || (iCol>=0 && iCol<pTab->nCol) );
#ifdef SQLITE_ENABLE_COLUMN_METADATA
        if( iCol<0 ){
          zType = "INTEGER";
          zOrigCol = "rowid";
        }else{
          zOrigCol = pTab->aCol[iCol].zName;
          zType = sqlite3ColumnType(&pTab->aCol[iCol],0);
          estWidth = pTab->aCol[iCol].szEst;
        }
        zOrigTab = pTab->zName;
        if( pNC->pParse ){
          int iDb = sqlite3SchemaToIndex(pNC->pParse->db, pTab->pSchema);
          zOrigDb = pNC->pParse->db->aDb[iDb].zDbSName;
        }
#else
        if( iCol<0 ){
          zType = "INTEGER";
        }else{
          zType = sqlite3ColumnType(&pTab->aCol[iCol],0);
          estWidth = pTab->aCol[iCol].szEst;
        }
#endif
      }
      break;
    }
#ifndef SQLITE_OMIT_SUBQUERY
    case TK_SELECT: {
      /* The expression is a sub-select. Return the declaration type and
      ** origin info for the single column in the result set of the SELECT
      ** statement.
      */
      NameContext sNC;
      Select *pS = pExpr->x.pSelect;
      Expr *p = pS->pEList->a[0].pExpr;
      assert( ExprHasProperty(pExpr, EP_xIsSelect) );
      sNC.pSrcList = pS->pSrc;
      sNC.pNext = pNC;
      sNC.pParse = pNC->pParse;
      zType = columnType(&sNC, p, &zOrigDb, &zOrigTab, &zOrigCol, &estWidth); 
      break;
    }
#endif
  }

#ifdef SQLITE_ENABLE_COLUMN_METADATA  
  if( pzOrigDb ){
    assert( pzOrigTab && pzOrigCol );
    *pzOrigDb = zOrigDb;
    *pzOrigTab = zOrigTab;
    *pzOrigCol = zOrigCol;
  }
#endif
  if( pEstWidth ) *pEstWidth = estWidth;
  return zType;
}